

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void int_to_bytes_be(uchar *bytes,int value)

{
  int *piVar1;
  long lVar2;
  int value_local;
  
  piVar1 = &value_local;
  value_local = value;
  lVar2 = 4;
  while (lVar2 != 0) {
    bytes[lVar2 + -1] = (uchar)*piVar1;
    piVar1 = (int *)((long)piVar1 + 1);
    lVar2 = lVar2 + -1;
  }
  return;
}

Assistant:

void int_to_bytes_be(unsigned char *bytes, int value)
{
	const unsigned char *pValue = (const unsigned char *)&value;
	for(unsigned i = 0; i < sizeof(int); i++)
	{
#if defined(CONF_ARCH_ENDIAN_BIG)
		bytes[i] = pValue[i];
#else
		bytes[sizeof(int) - i - 1] = pValue[i];
#endif
	}
}